

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classification.hpp
# Opt level: O1

bool __thiscall
boost::algorithm::detail::is_any_ofF<char>::operator()(is_any_ofF<char> *this,char Ch)

{
  ulong uVar1;
  ulong uVar2;
  is_any_ofF<char> *piVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = this->m_Size;
  if (0x10 < uVar1) {
    this = (is_any_ofF<char> *)(this->m_Storage).m_dynSet;
  }
  uVar2 = uVar1;
  piVar3 = this;
  while (0 < (long)uVar2) {
    uVar4 = uVar2 >> 1;
    uVar5 = ~uVar4 + uVar2;
    uVar2 = uVar4;
    if ((piVar3->m_Storage).m_fixSet[uVar4] < Ch) {
      uVar2 = uVar5;
      piVar3 = (is_any_ofF<char> *)((piVar3->m_Storage).m_fixSet + uVar4 + 1);
    }
  }
  if (piVar3 == (is_any_ofF<char> *)((this->m_Storage).m_fixSet + uVar1)) {
    return false;
  }
  return (piVar3->m_Storage).m_fixSet[0] <= Ch;
}

Assistant:

bool operator()( Char2T Ch ) const
                {
                    const set_value_type* Storage=
                        (use_fixed_storage(m_Size))
                        ? &m_Storage.m_fixSet[0]
                        : m_Storage.m_dynSet;

                    return ::std::binary_search(Storage, Storage+m_Size, Ch);
                }